

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O3

predictor * __thiscall
Search::predictor::add_allowed
          (predictor *this,
          vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
          *a)

{
  long lVar1;
  ulong uVar2;
  
  lVar1 = *(long *)a;
  if (*(long *)(a + 8) != lVar1) {
    uVar2 = 0;
    do {
      add_to<unsigned_int>
                (this,&this->allowed_actions,&this->allowed_is_pointer,*(uint *)(lVar1 + uVar2 * 8),
                 false);
      add_to<float>(this,&this->allowed_actions_cost,&this->allowed_cost_is_pointer,
                    *(float *)(*(long *)a + 4 + uVar2 * 8),false);
      uVar2 = uVar2 + 1;
      lVar1 = *(long *)a;
    } while (uVar2 < (ulong)(*(long *)(a + 8) - lVar1 >> 3));
  }
  return this;
}

Assistant:

predictor& predictor::add_allowed(vector<pair<action, float>>& a)
{
  for (size_t i = 0; i < a.size(); i++)
  {
    add_to(allowed_actions, allowed_is_pointer, a[i].first, false);
    add_to(allowed_actions_cost, allowed_cost_is_pointer, a[i].second, false);
  }
  return *this;
}